

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_layout_space_rect_to_screen(nk_context *ctx,nk_rect ret)

{
  nk_panel *pnVar1;
  nk_rect nVar2;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_rect ret_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x46c5,
                  "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      pnVar1 = ctx->current->layout;
      ctx_local._0_4_ = ret.x;
      ctx_local._4_4_ = ret.y;
      ctx_local = (nk_context *)
                  CONCAT44(ctx_local._4_4_ + (pnVar1->at_y - (float)*pnVar1->offset_y),
                           ctx_local._0_4_ + (pnVar1->at_x - (float)*pnVar1->offset_x));
      nVar2.w = (float)(int)ret._8_8_;
      nVar2.h = (float)(int)((ulong)ret._8_8_ >> 0x20);
      nVar2._0_8_ = ctx_local;
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x46c7,
                  "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x46c6,
                "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
               );
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_screen(struct nk_context *ctx, struct nk_rect ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += layout->at_x - (float)*layout->offset_x;
    ret.y += layout->at_y - (float)*layout->offset_y;
    return ret;
}